

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

LayoutBindingTestResult * __thiscall
glcts::AtomicCounterLayoutBindingCase::binding_examples_one_binding
          (LayoutBindingTestResult *__return_storage_ptr__,AtomicCounterLayoutBindingCase *this)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  LayoutBindingProgram *pLVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  mapped_type_conflict *pmVar9;
  String local_1340;
  allocator<char> local_1319;
  String local_1318;
  String local_12f8;
  LayoutBindingProgramAutoPtr local_12d8;
  LayoutBindingProgramAutoPtr program_5;
  string local_12b0 [32];
  string local_1290 [32];
  String local_1270;
  string local_1250 [32];
  string local_1230 [32];
  string local_1210 [32];
  string local_11f0 [32];
  undefined1 local_11d0 [8];
  StringStream s_5;
  int local_1050;
  bool passed_5;
  int pass_1;
  String local_1028;
  LayoutBindingProgramAutoPtr local_1008;
  LayoutBindingProgramAutoPtr program_4;
  string local_fe0 [32];
  string local_fc0 [32];
  String local_fa0;
  string local_f80 [32];
  string local_f60 [32];
  string local_f40 [32];
  string local_f20 [32];
  undefined1 local_f00 [8];
  StringStream s_4;
  int local_d80;
  bool passed_4;
  int pass;
  LayoutBindingProgramAutoPtr local_d58;
  LayoutBindingProgramAutoPtr program_3;
  string local_d30 [32];
  String local_d10;
  string local_cf0 [32];
  string local_cd0 [32];
  undefined1 local_cb0 [8];
  StringStream s_3;
  undefined1 local_b30 [6];
  bool passed_3;
  LayoutBindingProgramAutoPtr local_b10;
  LayoutBindingProgramAutoPtr program_2;
  string local_ae8 [32];
  String local_ac8;
  string local_aa8 [32];
  string local_a88 [32];
  undefined1 local_a68 [8];
  StringStream s_2;
  undefined1 local_8e8 [6];
  bool passed_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  allocator<char> local_8a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  String local_840;
  uint local_81c;
  iterator iStack_818;
  uint idx;
  value_type_conflict1 local_80c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_808;
  const_iterator local_800;
  int *local_7f8;
  value_type_conflict1 local_7ec;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_7e8;
  const_iterator local_7e0;
  int *local_7d8;
  value_type_conflict1 local_7cc;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_7c8;
  const_iterator local_7c0;
  int *local_7b8;
  value_type_conflict1 local_7ac;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_7a8;
  const_iterator local_7a0;
  undefined1 local_798 [8];
  IntVector expected;
  undefined1 local_768 [8];
  StringIntMap offsets_1;
  value_type local_718;
  value_type local_6f8;
  value_type local_6d8;
  undefined1 local_6b8 [8];
  StringVector list_1;
  LayoutBindingProgramAutoPtr local_680;
  LayoutBindingProgramAutoPtr program_1;
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  String local_5d8;
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  undefined1 local_4b8 [8];
  StringStream s_1;
  undefined1 local_338 [6];
  bool passed_1;
  String local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  undefined1 local_2e0 [8];
  StringIntMap offsets;
  undefined1 local_290 [8];
  StringVector list;
  String local_270;
  LayoutBindingProgramAutoPtr local_250;
  LayoutBindingProgramAutoPtr program;
  string local_228 [32];
  String local_208;
  string local_1d8 [32];
  string local_1b8 [32];
  undefined1 local_198 [8];
  StringStream s;
  bool passed;
  AtomicCounterLayoutBindingCase *this_local;
  
  s.super_ostringstream._375_1_ = 1;
  StringStream::StringStream((StringStream *)local_198);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(local_1d8,this,0);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x1b])(local_1b8,this,local_1d8);
  poVar3 = std::operator<<((ostream *)local_198,local_1b8);
  std::operator<<(poVar3,";\n");
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::str();
  LayoutBindingBaseCase::setTemplateParam
            (&this->super_LayoutBindingBaseCase,"UNIFORM_ACCESS",&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  StringStream::reset((StringStream *)local_198);
  std::operator<<((ostream *)local_198,"layout(binding=0, offset=4) uniform atomic_uint;\n");
  poVar3 = std::operator<<((ostream *)local_198,"layout(binding=0) uniform atomic_uint ");
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(local_228,this,0);
  poVar3 = std::operator<<(poVar3,local_228);
  std::operator<<(poVar3,";\n");
  std::__cxx11::string::~string(local_228);
  std::__cxx11::ostringstream::str();
  LayoutBindingBaseCase::setTemplateParam
            (&this->super_LayoutBindingBaseCase,"UNIFORM_DECL",(String *)&program);
  std::__cxx11::string::~string((string *)&program);
  LayoutBindingBaseCase::updateTemplate(&this->super_LayoutBindingBaseCase);
  LayoutBindingProgram::LayoutBindingProgramAutoPtr::LayoutBindingProgramAutoPtr
            (&local_250,&(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier);
  pLVar4 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_250);
  bVar2 = LayoutBindingProgram::compiledAndLinked(pLVar4);
  bVar2 = (s.super_ostringstream._375_1_ & 1 & bVar2) != 0;
  s.super_ostringstream._375_1_ = bVar2;
  if (bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_290);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(&offsets._M_t._M_impl.super__Rb_tree_header._M_node_count,this,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_290,(value_type *)&offsets._M_t._M_impl.super__Rb_tree_header._M_node_count
               );
    std::__cxx11::string::~string
              ((string *)&offsets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pLVar4 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_250);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2f8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_290);
    (*pLVar4->_vptr_LayoutBindingProgram[5])(local_2e0,pLVar4,&local_2f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2f8);
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_290,0);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)local_2e0,pvVar8);
    bVar2 = (s.super_ostringstream._375_1_ & 1 & *pmVar9 == 4) != 0;
    s.super_ostringstream._375_1_ = bVar2;
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_338,"offset did not match requested",
                 (allocator<char> *)&s_1.super_ostringstream.field_0x177);
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_290,0);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_2e0,pvVar8);
      LayoutBindingBaseCase::generateLog<int,int>
                (&local_318,&this->super_LayoutBindingBaseCase,(String *)local_338,*pmVar9,1);
      LayoutBindingTestResult::LayoutBindingTestResult
                (__return_storage_ptr__,bVar2,&local_318,false);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)local_338);
      std::allocator<char>::~allocator((allocator<char> *)&s_1.super_ostringstream.field_0x177);
    }
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar2;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)local_2e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_290);
  }
  else {
    pLVar4 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_250);
    LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_270,pLVar4,false);
    LayoutBindingTestResult::LayoutBindingTestResult(__return_storage_ptr__,bVar2,&local_270,false);
    std::__cxx11::string::~string((string *)&local_270);
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  LayoutBindingProgram::LayoutBindingProgramAutoPtr::~LayoutBindingProgramAutoPtr(&local_250);
  StringStream::~StringStream((StringStream *)local_198);
  if (list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    s_1.super_ostringstream._374_1_ = 1;
    StringStream::StringStream((StringStream *)local_4b8);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_4f8,this,0);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1b])(local_4d8,this,local_4f8);
    poVar3 = std::operator<<((ostream *)local_4b8,local_4d8);
    std::operator<<(poVar3,";\n");
    std::__cxx11::string::~string(local_4d8);
    std::__cxx11::string::~string(local_4f8);
    poVar3 = std::operator<<((ostream *)local_4b8,"+");
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_538,this,1);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1b])(local_518,this,local_538);
    poVar3 = std::operator<<(poVar3,local_518);
    std::operator<<(poVar3,";\n");
    std::__cxx11::string::~string(local_518);
    std::__cxx11::string::~string(local_538);
    poVar3 = std::operator<<((ostream *)local_4b8,"+");
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_578,this,2);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1b])(local_558,this,local_578);
    poVar3 = std::operator<<(poVar3,local_558);
    std::operator<<(poVar3,";\n");
    std::__cxx11::string::~string(local_558);
    std::__cxx11::string::~string(local_578);
    poVar3 = std::operator<<((ostream *)local_4b8,"+");
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_5b8,this,3);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1b])(local_598,this,local_5b8);
    poVar3 = std::operator<<(poVar3,local_598);
    std::operator<<(poVar3,";\n");
    std::__cxx11::string::~string(local_598);
    std::__cxx11::string::~string(local_5b8);
    std::__cxx11::ostringstream::str();
    LayoutBindingBaseCase::setTemplateParam
              (&this->super_LayoutBindingBaseCase,"UNIFORM_ACCESS",&local_5d8);
    std::__cxx11::string::~string((string *)&local_5d8);
    StringStream::reset((StringStream *)local_4b8);
    poVar3 = std::operator<<((ostream *)local_4b8,"layout(binding=0, offset=4) uniform atomic_uint "
                            );
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_5f8,this,0);
    poVar3 = std::operator<<(poVar3,local_5f8);
    std::operator<<(poVar3,";\n");
    std::__cxx11::string::~string(local_5f8);
    poVar3 = std::operator<<((ostream *)local_4b8,"layout(binding=0) uniform atomic_uint ");
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_618,this,1);
    poVar3 = std::operator<<(poVar3,local_618);
    std::operator<<(poVar3,";\n");
    std::__cxx11::string::~string(local_618);
    poVar3 = std::operator<<((ostream *)local_4b8,"layout(binding=0) uniform atomic_uint ");
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_638,this,2);
    poVar3 = std::operator<<(poVar3,local_638);
    std::operator<<(poVar3,";\n");
    std::__cxx11::string::~string(local_638);
    poVar3 = std::operator<<((ostream *)local_4b8,"layout(binding=0) uniform atomic_uint ");
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_658,this,3);
    poVar3 = std::operator<<(poVar3,local_658);
    std::operator<<(poVar3,";\n");
    std::__cxx11::string::~string(local_658);
    std::__cxx11::ostringstream::str();
    LayoutBindingBaseCase::setTemplateParam
              (&this->super_LayoutBindingBaseCase,"UNIFORM_DECL",(String *)&program_1);
    std::__cxx11::string::~string((string *)&program_1);
    LayoutBindingBaseCase::updateTemplate(&this->super_LayoutBindingBaseCase);
    LayoutBindingProgram::LayoutBindingProgramAutoPtr::LayoutBindingProgramAutoPtr
              (&local_680,&(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier);
    pLVar4 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_680);
    bVar2 = LayoutBindingProgram::compiledAndLinked(pLVar4);
    bVar2 = (s_1.super_ostringstream._374_1_ & 1 & bVar2) != 0;
    s_1.super_ostringstream._374_1_ = bVar2;
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_6b8);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(&local_6d8,this,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_6b8,&local_6d8);
      std::__cxx11::string::~string((string *)&local_6d8);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(&local_6f8,this,1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_6b8,&local_6f8);
      std::__cxx11::string::~string((string *)&local_6f8);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(&local_718,this,2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_6b8,&local_718);
      std::__cxx11::string::~string((string *)&local_718);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(&offsets_1._M_t._M_impl.super__Rb_tree_header._M_node_count,this,3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_6b8,
                  (value_type *)&offsets_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string
                ((string *)&offsets_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pLVar4 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_680);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_6b8);
      (*pLVar4->_vptr_LayoutBindingProgram[5])
                (local_768,pLVar4,
                 &expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_798)
      ;
      local_7a8._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_798);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_7a0,
                 &local_7a8);
      local_7ac = 4;
      local_7b8 = (int *)std::vector<int,_std::allocator<int>_>::insert
                                   ((vector<int,_std::allocator<int>_> *)local_798,local_7a0,
                                    &local_7ac);
      local_7c8._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_798);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_7c0,
                 &local_7c8);
      local_7cc = 8;
      local_7d8 = (int *)std::vector<int,_std::allocator<int>_>::insert
                                   ((vector<int,_std::allocator<int>_> *)local_798,local_7c0,
                                    &local_7cc);
      local_7e8._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_798);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_7e0,
                 &local_7e8);
      local_7ec = 0xc;
      local_7f8 = (int *)std::vector<int,_std::allocator<int>_>::insert
                                   ((vector<int,_std::allocator<int>_> *)local_798,local_7e0,
                                    &local_7ec);
      local_808._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_798);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_800,
                 &local_808);
      local_80c = 0x10;
      iStack_818 = std::vector<int,_std::allocator<int>_>::insert
                             ((vector<int,_std::allocator<int>_> *)local_798,local_800,&local_80c);
      for (local_81c = 0; uVar5 = (ulong)local_81c,
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_6b8), uVar5 < sVar6; local_81c = local_81c + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_798,(ulong)local_81c);
        iVar1 = *pvVar7;
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_6b8,(ulong)local_81c);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)local_768,pvVar8);
        bVar2 = (s_1.super_ostringstream._374_1_ & 1 & iVar1 == *pmVar9) != 0;
        s_1.super_ostringstream._374_1_ = bVar2;
        if (!bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8a0,"offset of",&local_8a1);
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_6b8,(ulong)local_81c);
          std::__cxx11::string::string((string *)&local_8c8,(string *)pvVar8);
          std::operator+(&local_880,&local_8a0,&local_8c8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_8e8,"did not match requested",
                     (allocator<char> *)&s_2.super_ostringstream.field_0x177);
          std::operator+(&local_860,&local_880,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_8e8);
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_6b8,(ulong)local_81c);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                 *)local_768,pvVar8);
          iVar1 = *pmVar9;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_798,(ulong)local_81c);
          LayoutBindingBaseCase::generateLog<int,int>
                    (&local_840,&this->super_LayoutBindingBaseCase,&local_860,iVar1,*pvVar7);
          LayoutBindingTestResult::LayoutBindingTestResult
                    (__return_storage_ptr__,bVar2,&local_840,false);
          std::__cxx11::string::~string((string *)&local_840);
          std::__cxx11::string::~string((string *)&local_860);
          std::__cxx11::string::~string((string *)local_8e8);
          std::allocator<char>::~allocator((allocator<char> *)&s_2.super_ostringstream.field_0x177);
          std::__cxx11::string::~string((string *)&local_880);
          std::__cxx11::string::~string((string *)&local_8c8);
          std::__cxx11::string::~string((string *)&local_8a0);
          std::allocator<char>::~allocator(&local_8a1);
          list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          goto LAB_013cd4f4;
        }
      }
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
LAB_013cd4f4:
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_798);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_768);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_6b8);
    }
    else {
      pLVar4 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_680);
      LayoutBindingProgram::getErrorLog_abi_cxx11_
                ((String *)
                 &list_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pLVar4,false);
      LayoutBindingTestResult::LayoutBindingTestResult
                (__return_storage_ptr__,bVar2,
                 (String *)
                 &list_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::__cxx11::string::~string
                ((string *)
                 &list_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    LayoutBindingProgram::LayoutBindingProgramAutoPtr::~LayoutBindingProgramAutoPtr(&local_680);
    StringStream::~StringStream((StringStream *)local_4b8);
    if (list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      s_2.super_ostringstream._374_1_ = 1;
      StringStream::StringStream((StringStream *)local_a68);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(local_aa8,this,0);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x1b])(local_a88,this,local_aa8);
      poVar3 = std::operator<<((ostream *)local_a68,local_a88);
      std::operator<<(poVar3,";\n");
      std::__cxx11::string::~string(local_a88);
      std::__cxx11::string::~string(local_aa8);
      std::__cxx11::ostringstream::str();
      LayoutBindingBaseCase::setTemplateParam
                (&this->super_LayoutBindingBaseCase,"UNIFORM_ACCESS",&local_ac8);
      std::__cxx11::string::~string((string *)&local_ac8);
      StringStream::reset((StringStream *)local_a68);
      std::operator<<((ostream *)local_a68,"layout(binding=0, offset=4) uniform atomic_uint;\n");
      poVar3 = std::operator<<((ostream *)local_a68,"layout(offset=8) uniform atomic_uint ");
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(local_ae8,this,0);
      poVar3 = std::operator<<(poVar3,local_ae8);
      std::operator<<(poVar3,";\n");
      std::__cxx11::string::~string(local_ae8);
      std::__cxx11::ostringstream::str();
      LayoutBindingBaseCase::setTemplateParam
                (&this->super_LayoutBindingBaseCase,"UNIFORM_DECL",(String *)&program_2);
      std::__cxx11::string::~string((string *)&program_2);
      LayoutBindingBaseCase::updateTemplate(&this->super_LayoutBindingBaseCase);
      LayoutBindingProgram::LayoutBindingProgramAutoPtr::LayoutBindingProgramAutoPtr
                (&local_b10,&(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier);
      pLVar4 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_b10);
      bVar2 = LayoutBindingProgram::compiledAndLinked(pLVar4);
      bVar2 = (s_2.super_ostringstream._374_1_ & 1 & bVar2) != 0;
      s_2.super_ostringstream._374_1_ = bVar2;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b30,"should not compile",
                   (allocator<char> *)&s_3.super_ostringstream.field_0x177);
        LayoutBindingTestResult::LayoutBindingTestResult
                  (__return_storage_ptr__,!bVar2,(String *)local_b30,false);
        std::__cxx11::string::~string((string *)local_b30);
        std::allocator<char>::~allocator((allocator<char> *)&s_3.super_ostringstream.field_0x177);
      }
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
      list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = bVar2;
      LayoutBindingProgram::LayoutBindingProgramAutoPtr::~LayoutBindingProgramAutoPtr(&local_b10);
      StringStream::~StringStream((StringStream *)local_a68);
      if (list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        s_3.super_ostringstream._374_1_ = 1;
        StringStream::StringStream((StringStream *)local_cb0);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(local_cf0,this,0);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x1b])(local_cd0,this,local_cf0);
        poVar3 = std::operator<<((ostream *)local_cb0,local_cd0);
        std::operator<<(poVar3,";\n");
        std::__cxx11::string::~string(local_cd0);
        std::__cxx11::string::~string(local_cf0);
        std::__cxx11::ostringstream::str();
        LayoutBindingBaseCase::setTemplateParam
                  (&this->super_LayoutBindingBaseCase,"UNIFORM_ACCESS",&local_d10);
        std::__cxx11::string::~string((string *)&local_d10);
        StringStream::reset((StringStream *)local_cb0);
        poVar3 = std::operator<<((ostream *)local_cb0,"layout(offset=4) uniform atomic_uint ");
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(local_d30,this,0);
        poVar3 = std::operator<<(poVar3,local_d30);
        std::operator<<(poVar3,";\n");
        std::__cxx11::string::~string(local_d30);
        std::__cxx11::ostringstream::str();
        LayoutBindingBaseCase::setTemplateParam
                  (&this->super_LayoutBindingBaseCase,"UNIFORM_DECL",(String *)&program_3);
        std::__cxx11::string::~string((string *)&program_3);
        LayoutBindingBaseCase::updateTemplate(&this->super_LayoutBindingBaseCase);
        LayoutBindingProgram::LayoutBindingProgramAutoPtr::LayoutBindingProgramAutoPtr
                  (&local_d58,&(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier);
        pLVar4 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_d58);
        bVar2 = LayoutBindingProgram::compiledAndLinked(pLVar4);
        bVar2 = (s_3.super_ostringstream._374_1_ & 1 & bVar2) != 0;
        s_3.super_ostringstream._374_1_ = bVar2;
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pass,"should not compile",(allocator<char> *)&passed_4);
          LayoutBindingTestResult::LayoutBindingTestResult
                    (__return_storage_ptr__,!bVar2,(String *)&pass,false);
          std::__cxx11::string::~string((string *)&pass);
          std::allocator<char>::~allocator((allocator<char> *)&passed_4);
        }
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = bVar2;
        LayoutBindingProgram::LayoutBindingProgramAutoPtr::~LayoutBindingProgramAutoPtr(&local_d58);
        StringStream::~StringStream((StringStream *)local_cb0);
        if (list.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
          for (local_d80 = 0; local_d80 < 2; local_d80 = local_d80 + 1) {
            s_4.super_ostringstream._375_1_ = 1;
            StringStream::StringStream((StringStream *)local_f00);
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])(local_f40,this,0);
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x1b])(local_f20,this,local_f40);
            poVar3 = std::operator<<((ostream *)local_f00,local_f20);
            std::operator<<(poVar3,";\n");
            std::__cxx11::string::~string(local_f20);
            std::__cxx11::string::~string(local_f40);
            if (local_d80 != 0) {
              poVar3 = std::operator<<((ostream *)local_f00,"+");
              (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[0x17])(local_f80,this,1);
              (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[0x1b])(local_f60,this,local_f80);
              poVar3 = std::operator<<(poVar3,local_f60);
              std::operator<<(poVar3,";\n");
              std::__cxx11::string::~string(local_f60);
              std::__cxx11::string::~string(local_f80);
            }
            std::__cxx11::ostringstream::str();
            LayoutBindingBaseCase::setTemplateParam
                      (&this->super_LayoutBindingBaseCase,"UNIFORM_ACCESS",&local_fa0);
            std::__cxx11::string::~string((string *)&local_fa0);
            StringStream::reset((StringStream *)local_f00);
            poVar3 = std::operator<<((ostream *)local_f00,
                                     "layout(binding=0, offset=0) uniform atomic_uint ");
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])(local_fc0,this,0);
            poVar3 = std::operator<<(poVar3,local_fc0);
            std::operator<<(poVar3,";\n");
            std::__cxx11::string::~string(local_fc0);
            if (local_d80 != 0) {
              poVar3 = std::operator<<((ostream *)local_f00,
                                       "layout(binding=0, offset=0) uniform atomic_uint ");
              (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[0x17])(local_fe0,this,1);
              poVar3 = std::operator<<(poVar3,local_fe0);
              std::operator<<(poVar3,";\n");
              std::__cxx11::string::~string(local_fe0);
            }
            std::__cxx11::ostringstream::str();
            LayoutBindingBaseCase::setTemplateParam
                      (&this->super_LayoutBindingBaseCase,"UNIFORM_DECL",(String *)&program_4);
            std::__cxx11::string::~string((string *)&program_4);
            LayoutBindingBaseCase::updateTemplate(&this->super_LayoutBindingBaseCase);
            LayoutBindingProgram::LayoutBindingProgramAutoPtr::LayoutBindingProgramAutoPtr
                      (&local_1008,
                       &(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier);
            pLVar4 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_1008);
            bVar2 = LayoutBindingProgram::compiledAndLinked(pLVar4);
            bVar2 = (s_4.super_ostringstream._375_1_ & 1 & bVar2) != 0;
            s_4.super_ostringstream._375_1_ = bVar2;
            if (local_d80 == 0) {
              if (bVar2) goto LAB_013ce3bf;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&pass_1,"should not compile",(allocator<char> *)&passed_5);
              LayoutBindingTestResult::LayoutBindingTestResult
                        (__return_storage_ptr__,bVar2,(String *)&pass_1,false);
              std::__cxx11::string::~string((string *)&pass_1);
              std::allocator<char>::~allocator((allocator<char> *)&passed_5);
              list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
            }
            else if (bVar2) {
              pLVar4 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_1008);
              LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_1028,pLVar4,false);
              LayoutBindingTestResult::LayoutBindingTestResult
                        (__return_storage_ptr__,bVar2,&local_1028,false);
              std::__cxx11::string::~string((string *)&local_1028);
              list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
            }
            else {
LAB_013ce3bf:
              list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            }
            LayoutBindingProgram::LayoutBindingProgramAutoPtr::~LayoutBindingProgramAutoPtr
                      (&local_1008);
            StringStream::~StringStream((StringStream *)local_f00);
            if (list.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
              return __return_storage_ptr__;
            }
          }
          for (local_1050 = 0; local_1050 < 2; local_1050 = local_1050 + 1) {
            s_5.super_ostringstream._375_1_ = 1;
            StringStream::StringStream((StringStream *)local_11d0);
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])(local_1210,this,0);
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x1b])(local_11f0,this,local_1210);
            poVar3 = std::operator<<((ostream *)local_11d0,local_11f0);
            std::operator<<(poVar3,";\n");
            std::__cxx11::string::~string(local_11f0);
            std::__cxx11::string::~string(local_1210);
            if (local_1050 != 0) {
              poVar3 = std::operator<<((ostream *)local_11d0,"+");
              (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[0x17])(local_1250,this,1);
              (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[0x1b])(local_1230,this,local_1250);
              poVar3 = std::operator<<(poVar3,local_1230);
              std::operator<<(poVar3,";\n");
              std::__cxx11::string::~string(local_1230);
              std::__cxx11::string::~string(local_1250);
            }
            std::__cxx11::ostringstream::str();
            LayoutBindingBaseCase::setTemplateParam
                      (&this->super_LayoutBindingBaseCase,"UNIFORM_ACCESS",&local_1270);
            std::__cxx11::string::~string((string *)&local_1270);
            StringStream::reset((StringStream *)local_11d0);
            poVar3 = std::operator<<((ostream *)local_11d0,
                                     "layout(binding=0, offset=0) uniform atomic_uint ");
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])(local_1290,this,0);
            poVar3 = std::operator<<(poVar3,local_1290);
            std::operator<<(poVar3,";\n");
            std::__cxx11::string::~string(local_1290);
            if (local_1050 != 0) {
              poVar3 = std::operator<<((ostream *)local_11d0,
                                       "layout(binding=0, offset=2) uniform atomic_uint ");
              (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[0x17])(local_12b0,this,1);
              poVar3 = std::operator<<(poVar3,local_12b0);
              std::operator<<(poVar3,";\n");
              std::__cxx11::string::~string(local_12b0);
            }
            std::__cxx11::ostringstream::str();
            LayoutBindingBaseCase::setTemplateParam
                      (&this->super_LayoutBindingBaseCase,"UNIFORM_DECL",(String *)&program_5);
            std::__cxx11::string::~string((string *)&program_5);
            LayoutBindingBaseCase::updateTemplate(&this->super_LayoutBindingBaseCase);
            LayoutBindingProgram::LayoutBindingProgramAutoPtr::LayoutBindingProgramAutoPtr
                      (&local_12d8,
                       &(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier);
            pLVar4 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_12d8);
            bVar2 = LayoutBindingProgram::compiledAndLinked(pLVar4);
            bVar2 = (s_5.super_ostringstream._375_1_ & 1 & bVar2) != 0;
            s_5.super_ostringstream._375_1_ = bVar2;
            if (local_1050 == 0) {
              if (bVar2) goto LAB_013cea41;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1318,"should not compile",&local_1319);
              LayoutBindingTestResult::LayoutBindingTestResult
                        (__return_storage_ptr__,bVar2,&local_1318,false);
              std::__cxx11::string::~string((string *)&local_1318);
              std::allocator<char>::~allocator(&local_1319);
              list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
            }
            else if (bVar2) {
              pLVar4 = LayoutBindingProgram::LayoutBindingProgramAutoPtr::operator->(&local_12d8);
              LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_12f8,pLVar4,false);
              LayoutBindingTestResult::LayoutBindingTestResult
                        (__return_storage_ptr__,bVar2,&local_12f8,false);
              std::__cxx11::string::~string((string *)&local_12f8);
              list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
            }
            else {
LAB_013cea41:
              list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            }
            LayoutBindingProgram::LayoutBindingProgramAutoPtr::~LayoutBindingProgramAutoPtr
                      (&local_12d8);
            StringStream::~StringStream((StringStream *)local_11d0);
            if (list.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
              return __return_storage_ptr__;
            }
          }
          std::__cxx11::string::string((string *)&local_1340);
          LayoutBindingTestResult::LayoutBindingTestResult
                    (__return_storage_ptr__,true,&local_1340,false);
          std::__cxx11::string::~string((string *)&local_1340);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult binding_examples_one_binding(void)
	{
		// example 1 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=0, offset=4) uniform atomic_uint;\n";
			s << "layout(binding=0) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}

			StringVector list;
			list.push_back(getDefaultUniformName());

			StringIntMap offsets = program->getOffsets(list);
			passed &= (4 == offsets[list[0]]);
			if (!passed)
			{
				return LayoutBindingTestResult(
					passed, generateLog(String("offset did not match requested"), offsets[list[0]], 1));
			}
		}

		// example 2 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			s << "+" << buildAccess(getDefaultUniformName(1)) << ";\n";
			s << "+" << buildAccess(getDefaultUniformName(2)) << ";\n";
			s << "+" << buildAccess(getDefaultUniformName(3)) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=0, offset=4) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			s << "layout(binding=0) uniform atomic_uint " << getDefaultUniformName(1) << ";\n";
			s << "layout(binding=0) uniform atomic_uint " << getDefaultUniformName(2) << ";\n";
			s << "layout(binding=0) uniform atomic_uint " << getDefaultUniformName(3) << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}

			StringVector list;
			list.push_back(getDefaultUniformName());
			list.push_back(getDefaultUniformName(1));
			list.push_back(getDefaultUniformName(2));
			list.push_back(getDefaultUniformName(3));

			StringIntMap offsets = program->getOffsets(list);
			IntVector	expected;
			expected.insert(expected.end(), 4);
			expected.insert(expected.end(), 8);
			expected.insert(expected.end(), 12);
			expected.insert(expected.end(), 16);
			for (unsigned int idx = 0; idx < list.size(); idx++)
			{
				passed &= (expected[idx] == offsets[list[idx]]);
				if (!passed)
				{
					return LayoutBindingTestResult(
						passed, generateLog(String("offset of") + String(list[idx]) + String("did not match requested"),
											offsets[list[idx]], expected[idx]));
				}
			}
		}

		// example 3 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=0, offset=4) uniform atomic_uint;\n";
			s << "layout(offset=8) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (passed)
			{
				return LayoutBindingTestResult(!passed, String("should not compile"));
			}
		}

		// example 4 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(offset=4) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (passed)
			{
				return LayoutBindingTestResult(!passed, String("should not compile"));
			}
		}

		// example 5 in atomic counter CTS spec ac-binding-examples
		// first check working example, then amend it with an error
		for (int pass = 0; pass < 2; pass++)
		{
			bool passed = true;

			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			if (pass)
				s << "+" << buildAccess(getDefaultUniformName(1)) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=0, offset=0) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			if (pass)
				s << "layout(binding=0, offset=0) uniform atomic_uint " << getDefaultUniformName(1) << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (pass != 0)
			{
				if (passed)
				{
					return LayoutBindingTestResult(passed, program->getErrorLog());
				}
			}
			else
			{
				if (!passed)
				{
					return LayoutBindingTestResult(passed, String("should not compile"));
				}
			}
		}

		// example 6 in atomic counter CTS spec ac-binding-examples
		// first check working example, then amend it with an error
		for (int pass = 0; pass < 2; pass++)
		{
			bool passed = true;

			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			if (pass)
				s << "+" << buildAccess(getDefaultUniformName(1)) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=0, offset=0) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			if (pass)
				s << "layout(binding=0, offset=2) uniform atomic_uint " << getDefaultUniformName(1) << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (pass != 0)
			{
				if (passed)
				{
					return LayoutBindingTestResult(passed, program->getErrorLog());
				}
			}
			else
			{
				if (!passed)
				{
					return LayoutBindingTestResult(passed, String("should not compile"));
				}
			}
		}

		return true;
	}